

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O2

char * stun_err_reason(int err_code)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = (char *)0x0;
  lVar1 = 0;
  do {
    lVar4 = lVar1;
    if (lVar4 + 0x10 == 0x120) goto LAB_00133921;
    lVar1 = lVar4 + 0x10;
  } while (*(int *)((long)&err_msg_map[0].err_code + lVar4) != err_code);
  pcVar3 = *(char **)((long)&err_msg_map[0].err_msg + lVar4);
LAB_00133921:
  pcVar2 = "???";
  if (pcVar3 != (char *)0x0) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

const char *stun_err_reason(int err_code) {
  int i;
  const char *msg = NULL;
  for (i = 0; i < sizeof(err_msg_map) / sizeof(err_msg_map[0]); i++) {
    if (err_msg_map[i].err_code == err_code) {
      msg = err_msg_map[i].err_msg;
      break;
    }
  }
  /* Avoiding to return NULL for unknown codes */
  return (msg == NULL) ? "???" : msg;
}